

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

int BN_asc2bn(BIGNUM **a,char *str)

{
  int iVar1;
  int iVar2;
  code *want_char;
  code *decode;
  char *in;
  
  in = str + (*str == '-');
  if ((str[*str == '-'] == '0') && ((byte)(in[1] | 0x20U) == 0x78)) {
    in = in + 2;
    decode = decode_hex;
    want_char = OPENSSL_isxdigit;
  }
  else {
    decode = decode_dec;
    want_char = OPENSSL_isdigit;
  }
  iVar1 = bn_x2bn((BIGNUM **)a,in,decode,want_char);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    if (*str == '-') {
      iVar2 = BN_is_zero((BIGNUM *)*a);
      if (iVar2 == 0) {
        (*a)->neg = 1;
      }
    }
  }
  return iVar1;
}

Assistant:

int BN_asc2bn(BIGNUM **outp, const char *in) {
  const char *const orig_in = in;
  if (*in == '-') {
    in++;
  }

  if (in[0] == '0' && (in[1] == 'X' || in[1] == 'x')) {
    if (!BN_hex2bn(outp, in + 2)) {
      return 0;
    }
  } else {
    if (!BN_dec2bn(outp, in)) {
      return 0;
    }
  }

  if (*orig_in == '-' && !BN_is_zero(*outp)) {
    (*outp)->neg = 1;
  }

  return 1;
}